

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_type.h
# Opt level: O2

void density::f_destroy::
     invoke<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>>::Data>
               (void *i_object)

{
  std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
            ((_Vector_base<char_*,_std::allocator<char_*>_> *)i_object);
  density_tests::InstanceCounted::~InstanceCounted((InstanceCounted *)i_object);
  return;
}

Assistant:

static void invoke(void * i_object) noexcept
        {
            DENSITY_ASSUME(i_object != nullptr);
            TARGET_TYPE * obj = static_cast<TARGET_TYPE *>(i_object);
            static_assert(
              noexcept(obj->TARGET_TYPE::~TARGET_TYPE()),
              "TARGET_TYPE must be nothrow destructible");
            obj->TARGET_TYPE::~TARGET_TYPE();
        }